

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O0

int os_interface_linux_mac_set(os_interface *os_if,netaddr *mac)

{
  oonf_log_source oVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_c6 [8];
  netaddr_str nbuf;
  ifreq if_req;
  netaddr *mac_local;
  os_interface *os_if_local;
  
  oVar1 = _oonf_os_interface_subsystem.logging;
  if_req.ifr_ifru._16_8_ = mac;
  if (mac->_type == '/') {
    memset(nbuf.buf + 0x36,0,0x28);
    strscpy(nbuf.buf + 0x36,os_if->name,0x10);
    if_req.ifr_ifrn._8_2_ = 1;
    netaddr_to_binary((undefined1 *)((long)&if_req.ifr_ifrn + 10),if_req.ifr_ifru._16_8_,6);
    iVar2 = os_system_linux_linux_get_ioctl_fd(2);
    iVar2 = ioctl(iVar2,0x8924,nbuf.buf + 0x36);
    oVar1 = _oonf_os_interface_subsystem.logging;
    if (iVar2 < 0) {
      if (((&log_global_mask)[_oonf_os_interface_subsystem.logging] & 4) != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        piVar4 = __errno_location();
        oonf_log(4,oVar1,"src/base/os_linux/os_interface_linux.c",0x20f,0,0,
                 "Could not set mac address of \'%s\': %s (%d)",os_if->name,pcVar5,*piVar4);
      }
      os_if_local._4_4_ = -1;
    }
    else {
      os_if_local._4_4_ = 0;
    }
  }
  else {
    if (((&log_global_mask)[_oonf_os_interface_subsystem.logging] & 4) != 0) {
      uVar3 = netaddr_to_prefixstring(local_c6,mac,0);
      oonf_log(4,oVar1,"src/base/os_linux/os_interface_linux.c",0x204,0,0,
               "Interface MAC must mac48, not %s",uVar3);
    }
    os_if_local._4_4_ = -1;
  }
  return os_if_local._4_4_;
}

Assistant:

int
os_interface_linux_mac_set(struct os_interface *os_if, struct netaddr *mac) {
  struct ifreq if_req;
  struct netaddr_str nbuf;

  if (netaddr_get_address_family(mac) != AF_MAC48) {
    OONF_WARN(LOG_OS_INTERFACE, "Interface MAC must mac48, not %s", netaddr_to_string(&nbuf, mac));
    return -1;
  }

  memset(&if_req, 0, sizeof(if_req));
  strscpy(if_req.ifr_name, os_if->name, IF_NAMESIZE);

  if_req.ifr_addr.sa_family = ARPHRD_ETHER;
  netaddr_to_binary(&if_req.ifr_addr.sa_data, mac, 6);

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCSIFHWADDR, &if_req) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "Could not set mac address of '%s': %s (%d)", os_if->name, strerror(errno), errno);
    return -1;
  }
  return 0;
}